

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeglfsemulatorintegration.cpp
# Opt level: O3

bool __thiscall
QEglFSEmulatorIntegration::hasCapability(QEglFSEmulatorIntegration *this,Capability cap)

{
  return cap - ThreadedPixmaps < 3;
}

Assistant:

bool QEglFSEmulatorIntegration::hasCapability(QPlatformIntegration::Capability cap) const
{
    switch (cap) {
    case QPlatformIntegration::ThreadedPixmaps:
    case QPlatformIntegration::OpenGL:
    case QPlatformIntegration::ThreadedOpenGL:
        return true;
    default:
        return false;
    }
}